

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

Sfm_Ntk_t * Abc_NtkExtractMfs(Abc_Ntk_t *pNtk,int nFirstFixed)

{
  Vec_Ptr_t *p;
  Vec_Wec_t *vFanins;
  Vec_Str_t *vFixed;
  Vec_Wrd_t *vTruths;
  long *plVar1;
  word Entry;
  Vec_Int_t *pVVar2;
  Abc_Obj_t *pAVar3;
  Sfm_Ntk_t *pSVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  int i;
  int iVar6;
  long lVar7;
  
  if (nFirstFixed == 0) {
    p = Abc_NtkAssignIDs(pNtk);
  }
  else {
    p = Abc_NtkAssignIDs2(pNtk);
  }
  iVar6 = p->nSize + pNtk->vCis->nSize + pNtk->vCos->nSize;
  vFanins = Vec_WecStart(iVar6);
  vFixed = Vec_StrStart(iVar6);
  vTruths = Vec_WrdStart(iVar6);
  for (iVar6 = 0; iVar6 < p->nSize; iVar6 = iVar6 + 1) {
    plVar1 = (long *)Vec_PtrEntry(p,iVar6);
    Entry = Abc_SopToTruth((char *)plVar1[7],*(int *)((long)plVar1 + 0x1c));
    Vec_WrdWriteEntry(vTruths,(int)plVar1[8],Entry);
    if (1 < Entry + 1) {
      pVVar2 = Vec_WecEntry(vFanins,(int)plVar1[8]);
      Vec_IntGrow(pVVar2,*(int *)((long)plVar1 + 0x1c));
      for (lVar7 = 0; lVar7 < *(int *)((long)plVar1 + 0x1c); lVar7 = lVar7 + 1) {
        Vec_IntPush(pVVar2,*(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                             (long)*(int *)(plVar1[4] + lVar7 * 4) * 8) + 0x40));
      }
    }
  }
  for (iVar6 = 0; iVar6 < pNtk->vCos->nSize; iVar6 = iVar6 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,iVar6);
    pVVar2 = Vec_WecEntry(vFanins,(pAVar3->field_6).iTemp);
    Vec_IntGrow(pVVar2,(pAVar3->vFanins).nSize);
    for (lVar7 = 0; lVar7 < (pAVar3->vFanins).nSize; lVar7 = lVar7 + 1) {
      Vec_IntPush(pVVar2,*(int *)((long)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar7]]
                                 + 0x40));
    }
  }
  Vec_PtrFree(p);
  iVar6 = pNtk->vCis->nSize;
  uVar5 = extraout_RDX;
  for (i = iVar6; i < iVar6 + nFirstFixed; i = i + 1) {
    Vec_StrWriteEntry(vFixed,i,(char)uVar5);
    iVar6 = pNtk->vCis->nSize;
    uVar5 = extraout_RDX_00;
  }
  if ((-1 < nFirstFixed) && (nFirstFixed < pNtk->nObjCounts[7])) {
    pSVar4 = Sfm_NtkConstruct(vFanins,iVar6,pNtk->vCos->nSize,vFixed,(Vec_Str_t *)0x0,vTruths);
    return pSVar4;
  }
  __assert_fail("nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                ,0x82,"Sfm_Ntk_t *Abc_NtkExtractMfs(Abc_Ntk_t *, int)");
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs( Abc_Ntk_t * pNtk, int nFirstFixed )
{
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs;
    vNodes  = nFirstFixed ? Abc_NtkAssignIDs2(pNtk) : Abc_NtkAssignIDs(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
        Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
        if ( uTruth == 0 || ~uTruth == 0 )
            continue;
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    for ( i = Abc_NtkCiNum(pNtk); i < Abc_NtkCiNum(pNtk) + nFirstFixed; i++ )
        Vec_StrWriteEntry( vFixed, i, (char)1 );
    // update fixed
    assert( nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk) );
//    for ( i = Abc_NtkCiNum(pNtk); i + Abc_NtkCoNum(pNtk) < Abc_NtkObjNum(pNtk); i++ )
//        if ( rand() % 10 == 0 )
//            Vec_StrWriteEntry( vFixed, i, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths );
}